

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int cm_zlib_gzwrite(gzFile file,voidpc buf,uint len)

{
  z_size_t zVar1;
  int iVar2;
  
  iVar2 = 0;
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) &&
     (iVar2 = 0, *(int *)((long)&file[4].pos + 4) == 0)) {
    if ((int)len < 0) {
      cm_zlib_gz_error((gz_statep)file,-3,"requested length does not fit in int");
    }
    else {
      zVar1 = gz_write((gz_statep)file,buf,(ulong)len);
      iVar2 = (int)zVar1;
    }
  }
  return iVar2;
}

Assistant:

int ZEXPORT gzwrite(file, buf, len)
    gzFile file;
    voidpc buf;
    unsigned len;
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* since an int is returned, make sure len fits in one, otherwise return
       with an error (this avoids a flaw in the interface) */
    if ((int)len < 0) {
        gz_error(state, Z_DATA_ERROR, "requested length does not fit in int");
        return 0;
    }

    /* write len bytes from buf (the return value will fit in an int) */
    return (int)gz_write(state, buf, len);
}